

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-app.cpp
# Opt level: O1

int __thiscall StateRecording::init(StateRecording *this,EVP_PKEY_CTX *ctx)

{
  pointer pfVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  undefined7 extraout_var;
  int iVar5;
  EVP_PKEY_CTX *ctx_00;
  Callback cbAudio;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 local_20;
  
  if (this->isStarted == false) {
    this->nKeysHave = 0;
    this->isStarted = true;
    LOCK();
    (this->interrupt)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->doRecord)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->doneRecording)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->doneCutoffSearch)._M_base._M_i = false;
    UNLOCK();
    this->totalSize_bytes = 0;
    pfVar1 = (this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->waveformF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    psVar2 = (this->waveformI16).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->waveformI16).super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_finish != psVar2) {
      (this->waveformI16).super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar2;
    }
    psVar3 = (this->keyPresses).
             super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->keyPresses).
        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish != psVar3) {
      (this->keyPresses).
      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar3;
    }
    local_78._8_8_ = 0;
    local_78._M_unused._M_object = this;
    pcStack_60 = std::
                 _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/keytap3-app.cpp:91:41)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/keytap3-app.cpp:91:41)>
               ::_M_manager;
    local_48 = (undefined1  [16])0x0;
    local_58 = (_Any_data)0x0;
    local_38 = 0xffffffffffffffff;
    uStack_30 = 0xffffffffffffffff;
    local_28 = 0;
    uStack_24 = 1;
    local_20 = 0x447a0000;
    std::
    function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
    ::operator=((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                 *)&local_58,
                (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                 *)&local_78);
    local_38._0_4_ = this->captureId;
    local_38._4_4_ = this->nChannels;
    uStack_30 = 16000;
    uStack_24 = 0;
    local_20 = 0x42c80000;
    ctx_00 = (EVP_PKEY_CTX *)&this->audioLogger;
    bVar4 = AudioLogger::install((AudioLogger *)ctx_00,(Parameters *)&local_58);
    iVar5 = (int)CONCAT71(extraout_var,bVar4);
    if (!bVar4) {
      init(ctx_00);
    }
    if ((code *)local_48._0_8_ != (code *)0x0) {
      (*(code *)local_48._0_8_)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  else {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

bool init() {
        if (isStarted) {
            return false;
        }

        nKeysHave = 0;
        isStarted = true;
        interrupt = false;
        doRecord = true;
        doneRecording = false;
        doneCutoffSearch = false;
        totalSize_bytes = 0;

        waveformF.clear();
        waveformI16.clear();
        keyPresses.clear();

        AudioLogger::Callback cbAudio = [&](const auto & frames) {
            const auto tStart = std::chrono::high_resolution_clock::now();

            {
                std::lock_guard lock(mutex);
                for (auto & frame : frames) {
                    waveformF.insert(waveformF.end(), frame.begin(), frame.end());
                }

                if (interrupt) {
                    doneRecording = true;
                    printf("\n[!] Recording interrupted\n");
                    return;
                }
                if (nKeysToCapture <= nKeysHave && !doneRecording) {
                    doneRecording = true;
                    printf("\n[+] Done recording\n");
                } else {
                    doRecord = true;
                }
            }

            const auto tEnd = std::chrono::high_resolution_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();

            if (tDiff > 3) {
                printf("[!] Audio callback took %ld ms\n", (long) tDiff);
            }
        };

        AudioLogger::Parameters parameters;
        parameters.callback = std::move(cbAudio);
        parameters.captureId = captureId;
        parameters.nChannels = nChannels;
        parameters.sampleRate = kSampleRate;
        parameters.filter = EAudioFilter::None;
        parameters.freqCutoff_Hz = kFreqCutoff_Hz;

        if (audioLogger.install(std::move(parameters)) == false) {
            fprintf(stderr, "Failed to install audio logger\n");
            return false;
        }

        return true;
    }